

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>::lerp
          (LightNodeImpl<embree::SceneGraph::AmbientLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  AmbientLight *light0;
  LightNodeImpl<embree::SceneGraph::AmbientLight> *this_00;
  long *in_RDX;
  long in_RSI;
  LightNode *in_RDI;
  Ref<embree::SceneGraph::LightNodeImpl<embree::SceneGraph::AmbientLight>_> light1;
  AmbientLight *in_stack_ffffffffffffff08;
  AmbientLight *local_d0;
  AmbientLight *local_70 [5];
  AmbientLight *local_48;
  AmbientLight **local_30;
  AmbientLight **local_28;
  AmbientLight **local_20;
  AmbientLight *local_10;
  AmbientLight **local_8;
  
  local_30 = local_70;
  if (*in_RDX == 0) {
    local_d0 = (AmbientLight *)0x0;
  }
  else {
    local_d0 = (AmbientLight *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
  }
  local_8 = local_70;
  local_10 = local_d0;
  local_70[0] = local_d0;
  if (local_d0 != (AmbientLight *)0x0) {
    (**(code **)(*(long *)local_d0 + 0x10))();
  }
  light0 = (AmbientLight *)operator_new(0x171557);
  this_00 = (LightNodeImpl<embree::SceneGraph::AmbientLight> *)(in_RSI + 0x70);
  local_28 = local_70;
  AmbientLight::lerp(light0,local_70[0],(float)((ulong)this_00 >> 0x20));
  LightNodeImpl(this_00,in_stack_ffffffffffffff08);
  (in_RDI->super_Node).super_RefCount._vptr_RefCount = (_func_int **)light0;
  local_48 = light0;
  if ((in_RDI->super_Node).super_RefCount._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_Node).super_RefCount._vptr_RefCount + 0x10))();
  }
  local_20 = local_70;
  if (local_70[0] != (AmbientLight *)0x0) {
    (**(code **)(*(long *)local_70[0] + 0x18))();
  }
  return (Ref<embree::SceneGraph::LightNode>)in_RDI;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }